

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptLayoutQualifierList(HlslGrammar *this,TQualifier *qualifier)

{
  bool bVar1;
  char *syntax;
  TIntermTyped *expr;
  HlslToken idToken;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLayout);
  if ((bVar1) &&
     (bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen), bVar1)
     ) {
    do {
      idToken.field_2.string = (TString *)0x0;
      idToken.loc.name = (TString *)0x0;
      idToken.loc.string = 0;
      idToken.loc.line = 0;
      idToken.loc.column = 0;
      bVar1 = acceptIdentifier(this,&idToken);
      if (!bVar1) break;
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
      if (bVar1) {
        bVar1 = acceptConditionalExpression(this,&expr);
        if (!bVar1) {
          syntax = "expression";
          goto LAB_003a86d7;
        }
        HlslParseContext::setLayoutQualifier
                  (this->parseContext,&idToken.loc,qualifier,idToken.field_2.string,expr);
      }
      else {
        HlslParseContext::setLayoutQualifier
                  (this->parseContext,&idToken.loc,qualifier,idToken.field_2.string);
      }
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
    } while (bVar1);
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
    if (bVar1) {
      return true;
    }
    syntax = ")";
LAB_003a86d7:
    expected(this,syntax);
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptLayoutQualifierList(TQualifier& qualifier)
{
    if (! acceptTokenClass(EHTokLayout))
        return false;

    // LEFT_PAREN
    if (! acceptTokenClass(EHTokLeftParen))
        return false;

    do {
        // identifier
        HlslToken idToken;
        if (! acceptIdentifier(idToken))
            break;

        // EQUAL expression
        if (acceptTokenClass(EHTokAssign)) {
            TIntermTyped* expr;
            if (! acceptConditionalExpression(expr)) {
                expected("expression");
                return false;
            }
            parseContext.setLayoutQualifier(idToken.loc, qualifier, *idToken.string, expr);
        } else
            parseContext.setLayoutQualifier(idToken.loc, qualifier, *idToken.string);

        // COMMA
        if (! acceptTokenClass(EHTokComma))
            break;
    } while (true);

    // RIGHT_PAREN
    if (! acceptTokenClass(EHTokRightParen)) {
        expected(")");
        return false;
    }

    return true;
}